

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkUniversal::IntFromDescriptor
          (ChLinkUniversal *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  Scalar SVar1;
  int iVar2;
  Scalar *pSVar3;
  undefined4 in_register_00000034;
  
  iVar2 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar2 != '\0') {
    SVar1 = (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,(ulong)off_L
                       );
    *pSVar3 = SVar1;
    SVar1 = (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                        (ulong)(off_L + 1));
    *pSVar3 = SVar1;
    SVar1 = (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                        (ulong)(off_L + 2));
    *pSVar3 = SVar1;
    SVar1 = (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)L,
                        (ulong)(off_L + 3));
    *pSVar3 = SVar1;
  }
  return;
}

Assistant:

void ChLinkUniversal::IntFromDescriptor(const unsigned int off_v,
                                        ChStateDelta& v,
                                        const unsigned int off_L,
                                        ChVectorDynamic<>& L) {
    if (!IsActive())
        return;

    L(off_L + 0) = m_cnstr_x.Get_l_i();
    L(off_L + 1) = m_cnstr_y.Get_l_i();
    L(off_L + 2) = m_cnstr_z.Get_l_i();
    L(off_L + 3) = m_cnstr_dot.Get_l_i();
}